

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed_arena.h
# Opt level: O1

void __thiscall MixedArena::~MixedArena(MixedArena *this)

{
  MixedArena *this_00;
  pointer ppvVar1;
  
  clear(this);
  if (((this->next)._M_b._M_p != (__pointer_type)0x0) &&
     (this_00 = (this->next)._M_b._M_p, this_00 != (MixedArena *)0x0)) {
    ~MixedArena(this_00);
    operator_delete(this_00,0x30);
  }
  ppvVar1 = (this->chunks).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppvVar1 != (pointer)0x0) {
    operator_delete(ppvVar1,(long)(this->chunks).super__Vector_base<void_*,_std::allocator<void_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppvVar1
                   );
    return;
  }
  return;
}

Assistant:

~MixedArena() {
    clear();
    if (next.load()) {
      delete next.load();
    }
  }